

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O3

void __thiscall
Assimp::ASEImporter::ConvertMeshes
          (ASEImporter *this,Mesh *mesh,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *avOutMeshes)

{
  vector<aiVertexWeight,std::allocator<aiVertexWeight>> *this_00;
  iterator iVar1;
  pointer paVar2;
  pointer paVar3;
  pointer paVar4;
  pointer paVar5;
  iterator __position;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  aiVertexWeight aVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  Logger *pLVar16;
  pointer pMVar17;
  ulong *puVar18;
  aiMesh *paVar19;
  ulong uVar20;
  aiFace *paVar21;
  aiVector3D *paVar22;
  uint *puVar23;
  aiColor4D *paVar24;
  aiBone *paVar25;
  aiVertexWeight *paVar26;
  void *pvVar27;
  pointer pBVar28;
  pointer pBVar29;
  pointer pFVar30;
  aiFace *paVar31;
  uint uVar32;
  ulong uVar33;
  pointer pBVar34;
  uint c;
  int iVar35;
  iterator __position_00;
  ulong uVar36;
  long lVar37;
  uint uVar38;
  Parser *pPVar39;
  pointer *ppaVar40;
  pointer ppVar41;
  long lVar42;
  pointer pMVar43;
  ulong *__s;
  aiBone **ppaVar44;
  pointer pBVar45;
  aiMesh *p_pcOut;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> vSubMaterials;
  undefined8 local_b0;
  aiMesh *local_a8;
  ulong *local_a0;
  aiBone **local_98;
  pair<unsigned_int,_float> local_90;
  pointer local_88;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> local_80;
  pointer local_68;
  ulong *local_60;
  ulong local_58;
  vector<aiMesh*,std::allocator<aiMesh*>> *local_50;
  ASEImporter *local_48;
  ulong *local_40;
  size_t local_38;
  
  uVar20 = (ulong)mesh->iMaterialIndex;
  pPVar39 = this->mParser;
  pMVar17 = (pPVar39->m_vMaterials).
            super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar33 = ((long)(pPVar39->m_vMaterials).
                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pMVar17 >> 5) *
           -0x2c8590b21642c859;
  local_50 = (vector<aiMesh*,std::allocator<aiMesh*>> *)avOutMeshes;
  local_48 = this;
  if (uVar33 < uVar20 || uVar33 - uVar20 == 0) {
    mesh->iMaterialIndex = (int)uVar33 - 1;
    pLVar16 = DefaultLogger::get();
    Logger::warn(pLVar16,"Material index is out of range");
    pPVar39 = local_48->mParser;
    uVar20 = (ulong)mesh->iMaterialIndex;
    pMVar17 = (pPVar39->m_vMaterials).
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (*(pointer *)
       &pMVar17[uVar20].avSubMaterials.
        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl ==
      *(pointer *)
       ((long)&pMVar17[uVar20].avSubMaterials.
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl + 8)) {
    paVar19 = (aiMesh *)operator_new(0x520);
    paVar19->mNumVertices = 0;
    paVar19->mNumFaces = 0;
    memset(&paVar19->mVertices,0,0xcc);
    paVar19->mBones = (aiBone **)0x0;
    paVar19->mMaterialIndex = 0;
    (paVar19->mName).length = 0;
    (paVar19->mName).data[0] = '\0';
    memset((paVar19->mName).data + 1,0x1b,0x3ff);
    paVar19->mNumAnimMeshes = 0;
    paVar19->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar19->mMethod = 0;
    (paVar19->mAABB).mMin.x = 0.0;
    (paVar19->mAABB).mMin.y = 0.0;
    (paVar19->mAABB).mMin.z = 0.0;
    (paVar19->mAABB).mMax.x = 0.0;
    (paVar19->mAABB).mMax.y = 0.0;
    (paVar19->mAABB).mMax.z = 0.0;
    memset(paVar19->mColors,0,0xa0);
    paVar19->mPrimitiveTypes = 4;
    paVar19->mMaterialIndex = 0xffffffff;
    (pPVar39->m_vMaterials).
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_start[uVar20].bNeed = true;
    paVar19->mColors[3] = (aiColor4D *)(ulong)mesh->iMaterialIndex;
    paVar19->mColors[2] = (aiColor4D *)mesh;
    iVar1._M_current = *(aiMesh ***)(local_50 + 8);
    local_b0 = paVar19;
    if (iVar1._M_current == *(aiMesh ***)(local_50 + 0x10)) {
      std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                (local_50,iVar1,(aiMesh **)&local_b0);
    }
    else {
      *iVar1._M_current = paVar19;
      *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
    }
    paVar19 = local_b0;
    if ((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar3 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (paVar2 != paVar3) {
        local_b0->mNumVertices = (int)((ulong)((long)paVar3 - (long)paVar2) >> 2) * -0x55555555;
        uVar15 = (int)((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x3e0f83e1;
        local_b0->mNumFaces = uVar15;
        uVar20 = (ulong)uVar15;
        puVar18 = (ulong *)operator_new__(uVar20 * 0x10 + 8);
        *puVar18 = uVar20;
        paVar21 = (aiFace *)(puVar18 + 1);
        if (uVar20 != 0) {
          paVar31 = paVar21;
          do {
            paVar31->mNumIndices = 0;
            paVar31->mIndices = (uint *)0x0;
            paVar31 = paVar31 + 1;
          } while (paVar31 != paVar21 + uVar20);
        }
        local_a8 = paVar19;
        paVar19->mFaces = paVar21;
        paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar3 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = ((long)paVar3 - (long)paVar2 >> 2) * -0x5555555555555555;
        uVar20 = SUB168(auVar8 * ZEXT816(0xc),0);
        if (SUB168(auVar8 * ZEXT816(0xc),8) != 0) {
          uVar20 = 0xffffffffffffffff;
        }
        paVar22 = (aiVector3D *)operator_new__(uVar20);
        lVar42 = (long)paVar3 - (long)paVar2;
        if (lVar42 != 0) {
          memset(paVar22,0,((lVar42 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        paVar19 = local_a8;
        local_a8->mVertices = paVar22;
        paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memcpy(paVar22,paVar2,
               (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar2);
        paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar3 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = ((long)paVar3 - (long)paVar2 >> 2) * -0x5555555555555555;
        uVar20 = 0xffffffffffffffff;
        if (SUB168(auVar9 * ZEXT816(0xc),8) == 0) {
          uVar20 = SUB168(auVar9 * ZEXT816(0xc),0);
        }
        paVar22 = (aiVector3D *)operator_new__(uVar20);
        lVar42 = (long)paVar3 - (long)paVar2;
        if (lVar42 != 0) {
          memset(paVar22,0,((lVar42 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        paVar19->mNormals = paVar22;
        paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memcpy(paVar22,paVar2,
               (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar2);
        ppaVar40 = &mesh->amTexCoords[0].
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        lVar42 = 0;
        do {
          if (((_Vector_impl_data *)(ppaVar40 + -1))->_M_start != *ppaVar40) {
            lVar37 = (long)*ppaVar40 - (long)((_Vector_impl_data *)(ppaVar40 + -1))->_M_start;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = (lVar37 >> 2) * -0x5555555555555555;
            uVar20 = SUB168(auVar10 * ZEXT816(0xc),0);
            if (SUB168(auVar10 * ZEXT816(0xc),8) != 0) {
              uVar20 = 0xffffffffffffffff;
            }
            pvVar27 = operator_new__(uVar20);
            memset(pvVar27,0,((lVar37 - 0xcU) / 0xc) * 0xc + 0xc);
            *(void **)((long)local_b0->mTextureCoords + lVar42 * 2) = pvVar27;
            memcpy(*(void **)((long)local_b0->mTextureCoords + lVar42 * 2),
                   ((_Vector_impl_data *)(ppaVar40 + -1))->_M_start,
                   (long)*ppaVar40 - (long)((_Vector_impl_data *)(ppaVar40 + -1))->_M_start);
            *(undefined4 *)((long)local_b0->mNumUVComponents + lVar42) =
                 *(undefined4 *)((long)mesh->mNumUVComponents + lVar42);
          }
          ppaVar40 = ppaVar40 + 3;
          lVar42 = lVar42 + 4;
        } while (lVar42 != 0x20);
        paVar4 = (mesh->mVertexColors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar5 = (mesh->mVertexColors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        paVar19 = local_b0;
        if (paVar4 != paVar5) {
          uVar33 = (long)paVar5 - (long)paVar4;
          uVar20 = 0xffffffffffffffff;
          if (-1 < (long)uVar33) {
            uVar20 = uVar33;
          }
          paVar24 = (aiColor4D *)operator_new__(uVar20);
          memset(paVar24,0,(uVar33 - 0x10 & 0xfffffffffffffff0) + 0x10);
          paVar19 = local_b0;
          local_b0->mColors[0] = paVar24;
          paVar4 = (mesh->mVertexColors).
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                   super__Vector_impl_data._M_start;
          memcpy(paVar24,paVar4,
                 (long)(mesh->mVertexColors).
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar4);
        }
        if (paVar19->mNumFaces != 0) {
          lVar42 = 0;
          lVar37 = 0;
          uVar20 = 0;
          do {
            *(undefined4 *)((long)&paVar19->mFaces->mNumIndices + lVar37) = 3;
            pvVar27 = operator_new__(0xc);
            *(void **)((long)&local_b0->mFaces->mIndices + lVar37) = pvVar27;
            **(undefined4 **)((long)&local_b0->mFaces->mIndices + lVar37) =
                 *(undefined4 *)
                  ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup)
                         .mIndices + lVar42);
            *(undefined4 *)(*(long *)((long)&local_b0->mFaces->mIndices + lVar37) + 4) =
                 *(undefined4 *)
                  ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup)
                         .mIndices + lVar42 + 4);
            *(undefined4 *)(*(long *)((long)&local_b0->mFaces->mIndices + lVar37) + 8) =
                 *(undefined4 *)
                  ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup)
                         .mIndices + lVar42 + 8);
            uVar20 = uVar20 + 1;
            lVar37 = lVar37 + 0x10;
            lVar42 = lVar42 + 0x84;
            paVar19 = local_b0;
          } while (uVar20 < local_b0->mNumFaces);
        }
        pBVar29 = (mesh->mBones).
                  super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pBVar34 = (mesh->mBones).
                  super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((pBVar29 != pBVar34) &&
           ((mesh->mBoneVertices).
            super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (mesh->mBoneVertices).
            super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    *)&local_80,(long)pBVar34 - (long)pBVar29 >> 5,(allocator_type *)&local_90);
          pBVar45 = (mesh->mBoneVertices).
                    super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar28 = (mesh->mBoneVertices).
                    super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pBVar45 != pBVar28) {
            uVar15 = 0;
            do {
              ppVar41 = (pBVar45->mBoneWeights).
                        super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (ppVar41 !=
                  (pBVar45->mBoneWeights).
                  super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                do {
                  local_90.second = ppVar41->second;
                  this_00 = (vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)
                            ((_Vector_impl *)
                             &((local_80.
                                super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_Material).
                              _vptr_Material + ppVar41->first);
                  __position._M_current = *(aiVertexWeight **)(this_00 + 8);
                  local_90.first = uVar15;
                  if (__position._M_current == *(aiVertexWeight **)(this_00 + 0x10)) {
                    std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                    _M_realloc_insert<aiVertexWeight_const&>
                              (this_00,__position,(aiVertexWeight *)&local_90);
                  }
                  else {
                    aVar11.mWeight = local_90.second;
                    aVar11.mVertexId = uVar15;
                    *__position._M_current = aVar11;
                    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
                  }
                  ppVar41 = ppVar41 + 1;
                } while (ppVar41 !=
                         (pBVar45->mBoneWeights).
                         super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
                pBVar28 = (mesh->mBoneVertices).
                          super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              pBVar45 = pBVar45 + 1;
              uVar15 = uVar15 + 1;
            } while (pBVar45 != pBVar28);
          }
          paVar19 = local_b0;
          local_b0->mNumBones = 0;
          pBVar29 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pBVar34 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar20 = 0;
          if (pBVar34 != pBVar29) {
            uVar15 = 1;
            uVar33 = 0;
            do {
              if (((_Vector_impl *)
                  &((local_80.
                     super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_Material)._vptr_Material)
                  [uVar33].super__Vector_impl_data._M_start !=
                  (pointer)(&((local_80.
                               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                               ._M_impl.super__Vector_impl_data._M_start)->super_Material).mName.
                             _M_dataplus)[uVar33 * 3]._M_p) {
                uVar32 = (int)uVar20 + 1;
                uVar20 = (ulong)uVar32;
                local_b0->mNumBones = uVar32;
                pBVar29 = (mesh->mBones).
                          super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pBVar34 = (mesh->mBones).
                          super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              uVar33 = (ulong)uVar15;
              uVar15 = uVar15 + 1;
            } while (uVar33 < (ulong)((long)pBVar34 - (long)pBVar29 >> 5));
            uVar20 = uVar20 << 3;
          }
          ppaVar44 = (aiBone **)operator_new__(uVar20);
          paVar19->mBones = ppaVar44;
          pBVar29 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pBVar34 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (pBVar34 != pBVar29) {
            uVar15 = 1;
            uVar20 = 0;
            pMVar17 = local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              local_a8 = (aiMesh *)(uVar20 * 3);
              if (((_Vector_impl *)&(pMVar17->super_Material)._vptr_Material)[uVar20].
                  super__Vector_impl_data._M_start !=
                  (pointer)(&(pMVar17->super_Material).mName._M_dataplus)[uVar20 * 3]._M_p) {
                local_a0 = (ulong *)CONCAT44(local_a0._4_4_,uVar15);
                local_98 = ppaVar44;
                paVar25 = (aiBone *)operator_new(0x460);
                (paVar25->mName).length = 0;
                (paVar25->mName).data[0] = '\0';
                memset((paVar25->mName).data + 1,0x1b,0x3ff);
                paVar25->mNumWeights = 0;
                paVar25->mWeights = (aiVertexWeight *)0x0;
                (paVar25->mOffsetMatrix).a1 = 1.0;
                (paVar25->mOffsetMatrix).a2 = 0.0;
                (paVar25->mOffsetMatrix).a3 = 0.0;
                (paVar25->mOffsetMatrix).a4 = 0.0;
                (paVar25->mOffsetMatrix).b1 = 0.0;
                (paVar25->mOffsetMatrix).b2 = 1.0;
                (paVar25->mOffsetMatrix).b3 = 0.0;
                (paVar25->mOffsetMatrix).b4 = 0.0;
                (paVar25->mOffsetMatrix).c1 = 0.0;
                (paVar25->mOffsetMatrix).c2 = 0.0;
                (paVar25->mOffsetMatrix).c3 = 1.0;
                (paVar25->mOffsetMatrix).c4 = 0.0;
                (paVar25->mOffsetMatrix).d1 = 0.0;
                (paVar25->mOffsetMatrix).d2 = 0.0;
                (paVar25->mOffsetMatrix).d3 = 0.0;
                (paVar25->mOffsetMatrix).d4 = 1.0;
                *local_98 = paVar25;
                pBVar29 = (mesh->mBones).
                          super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                uVar33 = pBVar29[uVar20].mName._M_string_length;
                if (uVar33 < 0x400) {
                  (paVar25->mName).length = (ai_uint32)uVar33;
                  memcpy((paVar25->mName).data,pBVar29[uVar20].mName._M_dataplus._M_p,uVar33);
                  (paVar25->mName).data[uVar33] = '\0';
                }
                local_68 = local_80.
                           super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                uVar36 = (long)(&((local_80.
                                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_Material).mName
                                 ._M_dataplus)[(long)local_a8]._M_p -
                         (long)(&(((_Vector_impl *)
                                  &((local_80.
                                     super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->super_Material).
                                   _vptr_Material)->super__Vector_impl_data)._M_start)
                               [(long)local_a8];
                uVar33 = (long)uVar36 >> 3;
                paVar25->mNumWeights = (uint)uVar33;
                uVar33 = uVar33 & 0xffffffff;
                uVar20 = uVar33 * 8;
                local_88 = pBVar29;
                paVar26 = (aiVertexWeight *)operator_new__(uVar20);
                if (uVar33 != 0) {
                  memset(paVar26,0,uVar20);
                }
                pMVar17 = local_68;
                paVar25->mWeights = paVar26;
                memcpy(paVar26,(&(((_Vector_impl *)&(local_68->super_Material)._vptr_Material)->
                                 super__Vector_impl_data)._M_start)[(long)local_a8],
                       uVar36 & 0x7fffffff8);
                ppaVar44 = local_98 + 1;
                pBVar34 = (mesh->mBones).
                          super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                pBVar29 = local_88;
                uVar15 = (uint)local_a0;
              }
              uVar20 = (ulong)uVar15;
              uVar15 = uVar15 + 1;
            } while (uVar20 < (ulong)((long)pBVar34 - (long)pBVar29 >> 5));
          }
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                     *)&local_80);
        }
      }
    }
  }
  else {
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::vector
              (&local_80,&pMVar17[uVar20].avSubMaterials);
    pMVar43 = local_80.
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pMVar17 = local_80.
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar20 = ((long)local_80.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_80.
                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x2e0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar20;
    uVar33 = SUB168(auVar6 * ZEXT816(0x18),0);
    uVar36 = uVar33 + 8;
    if (0xfffffffffffffff7 < uVar33) {
      uVar36 = 0xffffffffffffffff;
    }
    if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
      uVar36 = 0xffffffffffffffff;
    }
    puVar18 = (ulong *)operator_new__(uVar36);
    *puVar18 = uVar20;
    __s = puVar18 + 1;
    if (pMVar43 != pMVar17) {
      memset(__s,0,((uVar33 - 0x18) / 0x18) * 0x18 + 0x18);
    }
    local_b0 = (aiMesh *)((ulong)local_b0._4_4_ << 0x20);
    pFVar30 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
              super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_60 = __s;
    local_40 = puVar18;
    if ((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_finish != pFVar30) {
      uVar20 = 0;
      do {
        uVar33 = (ulong)pFVar30[uVar20].iMaterial;
        uVar36 = ((long)local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x2c8590b21642c859;
        if (uVar36 < uVar33 || uVar36 - uVar33 == 0) {
          pLVar16 = DefaultLogger::get();
          Logger::warn(pLVar16,"Submaterial index is out of range");
          lVar42 = (long)local_80.
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_80.
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          __position_00._M_current = (uint *)puVar18[lVar42 * -0x590b21642c8590b + -1];
          if (__position_00._M_current == (uint *)puVar18[lVar42 * -0x590b21642c8590b]) {
            lVar42 = lVar42 * -0x590b21642c8590b + -3;
            goto LAB_003f97bc;
          }
          lVar42 = lVar42 * -0x590b21642c8590b + -2;
          *__position_00._M_current = (uint)local_b0;
LAB_003f97a2:
          __s[lVar42] = __s[lVar42] + 4;
        }
        else {
          __position_00._M_current = (uint *)puVar18[uVar33 * 3 + 2];
          if (__position_00._M_current != (uint *)puVar18[uVar33 * 3 + 3]) {
            lVar42 = uVar33 * 3 + 1;
            *__position_00._M_current = (uint)uVar20;
            goto LAB_003f97a2;
          }
          lVar42 = uVar33 * 3;
LAB_003f97bc:
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)(__s + lVar42),
                     __position_00,(uint *)&local_b0);
        }
        uVar20 = (ulong)((uint)local_b0 + 1);
        local_b0 = (aiMesh *)CONCAT44(local_b0._4_4_,(uint)local_b0 + 1);
        pFVar30 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar33 = ((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pFVar30 >> 2) *
                 0xf83e0f83e0f83e1;
        pMVar43 = local_80.
                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pMVar17 = local_80.
                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar20 <= uVar33 && uVar33 - uVar20 != 0);
    }
    if (pMVar43 != pMVar17) {
      local_68 = (pointer)mesh->amTexCoords;
      local_58 = 0;
      do {
        uVar20 = local_58;
        if (local_60[local_58 * 3] != local_60[local_58 * 3 + 1]) {
          paVar19 = (aiMesh *)operator_new(0x520);
          paVar19->mNumVertices = 0;
          paVar19->mNumFaces = 0;
          memset(&paVar19->mVertices,0,0xcc);
          paVar19->mBones = (aiBone **)0x0;
          paVar19->mMaterialIndex = 0;
          (paVar19->mName).length = 0;
          (paVar19->mName).data[0] = '\0';
          memset((paVar19->mName).data + 1,0x1b,0x3ff);
          paVar19->mNumAnimMeshes = 0;
          paVar19->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar19->mMethod = 0;
          (paVar19->mAABB).mMin.x = 0.0;
          (paVar19->mAABB).mMin.y = 0.0;
          (paVar19->mAABB).mMin.z = 0.0;
          (paVar19->mAABB).mMax.x = 0.0;
          (paVar19->mAABB).mMax.y = 0.0;
          (paVar19->mAABB).mMax.z = 0.0;
          memset(paVar19->mColors,0,0xa0);
          paVar19->mPrimitiveTypes = 4;
          paVar19->mMaterialIndex = (uint)local_58;
          *(undefined1 *)
           (*(long *)&(local_48->mParser->m_vMaterials).
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start[mesh->iMaterialIndex].avSubMaterials
                      .
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl + 0x2d8 + uVar20 * 0x2e0) = 1;
          paVar19->mColors[3] = (aiColor4D *)(ulong)mesh->iMaterialIndex;
          paVar19->mColors[2] = (aiColor4D *)mesh;
          iVar1._M_current = *(aiMesh ***)(local_50 + 8);
          local_b0 = paVar19;
          if (iVar1._M_current == *(aiMesh ***)(local_50 + 0x10)) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      (local_50,iVar1,(aiMesh **)&local_b0);
          }
          else {
            *iVar1._M_current = paVar19;
            *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
          }
          paVar19 = local_b0;
          local_a0 = local_60 + uVar20 * 3;
          local_b0->mNumVertices = (int)(local_a0[1] - *local_a0 >> 2) * 3;
          uVar15 = (uint)(local_a0[1] - *local_a0 >> 2);
          local_b0->mNumFaces = uVar15;
          pBVar29 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pBVar34 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (pBVar29 == pBVar34) {
            local_a8 = (aiMesh *)0x0;
          }
          else {
            uVar36 = (long)pBVar34 - (long)pBVar29 >> 5;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar36;
            uVar20 = SUB168(auVar7 * ZEXT816(0x18),0);
            uVar33 = uVar20 + 8;
            if (0xfffffffffffffff7 < uVar20) {
              uVar33 = 0xffffffffffffffff;
            }
            if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
              uVar33 = 0xffffffffffffffff;
            }
            puVar18 = (ulong *)operator_new__(uVar33);
            *puVar18 = uVar36;
            local_a8 = (aiMesh *)(puVar18 + 1);
            memset(local_a8,0,((uVar36 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
            uVar15 = paVar19->mNumFaces;
          }
          uVar20 = (ulong)uVar15;
          puVar18 = (ulong *)operator_new__(uVar20 * 0x10 + 8);
          *puVar18 = uVar20;
          paVar21 = (aiFace *)(puVar18 + 1);
          if (uVar20 != 0) {
            paVar31 = paVar21;
            do {
              paVar31->mNumIndices = 0;
              paVar31->mIndices = (uint *)0x0;
              paVar31 = paVar31 + 1;
            } while (paVar31 != paVar21 + uVar20);
          }
          paVar19->mFaces = paVar21;
          if ((ulong)paVar19->mNumVertices != 0) {
            uVar20 = (ulong)paVar19->mNumVertices * 0xc;
            paVar22 = (aiVector3D *)operator_new__(uVar20);
            memset(paVar22,0,((uVar20 - 0xc) / 0xc) * 0xc + 0xc);
            paVar19->mVertices = paVar22;
            uVar15 = paVar19->mNumVertices;
            uVar20 = (ulong)uVar15 * 0xc;
            paVar22 = (aiVector3D *)operator_new__(uVar20);
            if (uVar15 != 0) {
              memset(paVar22,0,((uVar20 - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar19->mNormals = paVar22;
            uVar20 = *local_a0;
            if (local_a0[1] != uVar20) {
              pBVar29 = (pointer)0x0;
              uVar33 = 0;
              do {
                uVar15 = *(uint *)(uVar20 + (long)pBVar29 * 4);
                local_88 = pBVar29;
                puVar23 = (uint *)operator_new__(0xc);
                ppaVar44 = (aiBone **)((long)pBVar29 * 0x10);
                local_b0->mFaces[(long)pBVar29].mIndices = puVar23;
                local_b0->mFaces[(long)pBVar29].mNumIndices = 3;
                lVar42 = 0;
                local_98 = ppaVar44;
                do {
                  uVar20 = (ulong)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                                  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                  super_FaceWithSmoothingGroup.mIndices[lVar42];
                  paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar22 = local_b0->mVertices;
                  uVar32 = (uint)uVar33;
                  paVar22[uVar33].z = *(float *)((long)(paVar2 + uVar20) + 8);
                  paVar2 = paVar2 + uVar20;
                  fVar12 = paVar2->y;
                  paVar22 = paVar22 + uVar33;
                  paVar22->x = paVar2->x;
                  paVar22->y = fVar12;
                  paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar22 = local_b0->mNormals;
                  paVar22[uVar33].z = paVar2[uVar20].z;
                  paVar2 = paVar2 + uVar20;
                  fVar12 = paVar2->y;
                  paVar22 = paVar22 + uVar33;
                  paVar22->x = paVar2->x;
                  paVar22->y = fVar12;
                  if ((mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                      (mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    if (local_a8 == (aiMesh *)0x0) {
                      __assert_fail("avOutputBones",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/ASE/ASELoader.cpp"
                                    ,0x400,
                                    "void Assimp::ASEImporter::ConvertMeshes(ASE::Mesh &, std::vector<aiMesh *> &)"
                                   );
                    }
                    pBVar45 = (mesh->mBoneVertices).
                              super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar33 = ((long)(mesh->mBoneVertices).
                                    super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar45 >> 3)
                             * -0x5555555555555555;
                    if ((uVar20 <= uVar33 && uVar33 - uVar20 != 0) &&
                       (ppVar41 = *(pointer *)
                                   &pBVar45[uVar20].mBoneWeights.
                                    super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                    ._M_impl,
                       ppVar41 !=
                       *(pointer *)
                        ((long)&pBVar45[uVar20].mBoneWeights.
                                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                ._M_impl + 8))) {
                      do {
                        local_90.second = ppVar41->second;
                        local_90.first = uVar32;
                        std::
                        vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                        ::emplace_back<std::pair<unsigned_int,float>>
                                  ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                                    *)((long)local_a8 + (long)ppVar41->first * 3 * 8),&local_90);
                        ppVar41 = ppVar41 + 1;
                        ppaVar44 = local_98;
                      } while (ppVar41 !=
                               *(pointer *)
                                ((long)&(mesh->mBoneVertices).
                                        super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar20].
                                        mBoneWeights.
                                        super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                        ._M_impl + 8));
                    }
                  }
                  *(uint *)(*(long *)((long)&local_b0->mFaces->mIndices + (long)ppaVar44) +
                           lVar42 * 4) = uVar32;
                  lVar42 = lVar42 + 1;
                  uVar33 = (ulong)(uVar32 + 1);
                } while (lVar42 != 3);
                pBVar29 = (pointer)(ulong)((int)local_88 + 1);
                uVar20 = *local_a0;
              } while (pBVar29 < (pointer)((long)(local_a0[1] - uVar20) >> 2));
            }
          }
          lVar42 = 0;
          pMVar17 = local_68;
          do {
            paVar19 = local_b0;
            if (((_Vector_impl *)&(pMVar17->super_Material)._vptr_Material)[lVar42].
                super__Vector_impl_data._M_start !=
                (pointer)(&(pMVar17->super_Material).mName._M_dataplus)[lVar42 * 3]._M_p) {
              uVar15 = local_b0->mNumVertices;
              uVar20 = (ulong)uVar15 * 0xc;
              local_98 = (aiBone **)(lVar42 * 3);
              paVar22 = (aiVector3D *)operator_new__(uVar20);
              if (uVar15 != 0) {
                memset(paVar22,0,((uVar20 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar19->mTextureCoords[lVar42] = paVar22;
              uVar20 = *local_a0;
              if (local_a0[1] != uVar20) {
                uVar33 = 0;
                iVar35 = 0;
                do {
                  uVar15 = *(uint *)(uVar20 + uVar33 * 4);
                  lVar37 = 0;
                  do {
                    uVar38 = iVar35 + (int)lVar37;
                    uVar32 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar15].
                             super_FaceWithSmoothingGroup.mIndices[lVar37];
                    paVar2 = (&(((_Vector_impl *)&(local_68->super_Material)._vptr_Material)->
                               super__Vector_impl_data)._M_start)[(long)local_98];
                    paVar22 = local_b0->mTextureCoords[lVar42];
                    paVar22[uVar38].z = paVar2[uVar32].z;
                    paVar2 = paVar2 + uVar32;
                    fVar12 = paVar2->y;
                    paVar22 = paVar22 + uVar38;
                    paVar22->x = paVar2->x;
                    paVar22->y = fVar12;
                    lVar37 = lVar37 + 1;
                  } while (lVar37 != 3);
                  uVar33 = (ulong)((int)uVar33 + 1);
                  uVar20 = *local_a0;
                  iVar35 = iVar35 + 3;
                } while (uVar33 < (ulong)((long)(local_a0[1] - uVar20) >> 2));
              }
              local_b0->mNumUVComponents[lVar42] = mesh->mNumUVComponents[lVar42];
              pMVar17 = local_68;
            }
            paVar19 = local_b0;
            lVar42 = lVar42 + 1;
          } while (lVar42 != 8);
          if ((mesh->mVertexColors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (mesh->mVertexColors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            uVar15 = local_b0->mNumVertices;
            uVar20 = (ulong)uVar15 << 4;
            paVar24 = (aiColor4D *)operator_new__(uVar20);
            if (uVar15 != 0) {
              memset(paVar24,0,uVar20);
            }
            paVar19->mColors[0] = paVar24;
            uVar20 = *local_a0;
            if (local_a0[1] != uVar20) {
              uVar33 = 0;
              iVar35 = 0;
              do {
                uVar15 = *(uint *)(uVar20 + uVar33 * 4);
                lVar42 = 0;
                do {
                  paVar4 = (mesh->mVertexColors).
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start +
                           (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar15].
                           super_FaceWithSmoothingGroup.mIndices[lVar42];
                  fVar12 = paVar4->g;
                  fVar13 = paVar4->b;
                  fVar14 = paVar4->a;
                  paVar24 = paVar19->mColors[0] + (uint)(iVar35 + (int)lVar42);
                  paVar24->r = paVar4->r;
                  paVar24->g = fVar12;
                  paVar24->b = fVar13;
                  paVar24->a = fVar14;
                  lVar42 = lVar42 + 1;
                } while (lVar42 != 3);
                uVar33 = (ulong)((int)uVar33 + 1);
                uVar20 = *local_a0;
                iVar35 = iVar35 + 3;
              } while (uVar33 < (ulong)((long)(local_a0[1] - uVar20) >> 2));
            }
          }
          paVar19 = local_b0;
          pMVar43 = local_80.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pMVar17 = local_80.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_b0->mNumBones = 0;
            pBVar29 = (mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pBVar34 = (mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (pBVar34 == pBVar29) {
              uVar20 = 0;
            }
            else {
              uVar15 = 0;
              uVar32 = 1;
              uVar20 = 0;
              do {
                if (*(ulong *)((long)local_a8 + uVar20 * 3 * 8) !=
                    *(ulong *)((long)local_a8 + (uVar20 * 3 + 1) * 8)) {
                  uVar15 = uVar15 + 1;
                  local_b0->mNumBones = uVar15;
                  pBVar29 = (mesh->mBones).
                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pBVar34 = (mesh->mBones).
                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                uVar20 = (ulong)uVar32;
                uVar32 = uVar32 + 1;
              } while (uVar20 < (ulong)((long)pBVar34 - (long)pBVar29 >> 5));
              uVar20 = (ulong)uVar15 << 3;
            }
            ppaVar44 = (aiBone **)operator_new__(uVar20);
            paVar19->mBones = ppaVar44;
            pBVar29 = (mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pBVar34 = (mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            paVar19 = local_a8;
            if (pBVar34 == pBVar29) {
              pMVar43 = local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pMVar17 = local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_a8 == (aiMesh *)0x0) goto LAB_003fa134;
            }
            else {
              puVar18 = (ulong *)0x0;
              do {
                if (*(ulong *)((long)paVar19 + (long)puVar18 * 3 * 8) !=
                    *(ulong *)((long)paVar19 + ((long)puVar18 * 3 + 1) * 8)) {
                  local_a0 = puVar18;
                  local_98 = ppaVar44;
                  paVar25 = (aiBone *)operator_new(0x460);
                  (paVar25->mName).length = 0;
                  (paVar25->mName).data[0] = '\0';
                  memset((paVar25->mName).data + 1,0x1b,0x3ff);
                  paVar25->mNumWeights = 0;
                  paVar25->mWeights = (aiVertexWeight *)0x0;
                  (paVar25->mOffsetMatrix).a1 = 1.0;
                  (paVar25->mOffsetMatrix).a2 = 0.0;
                  (paVar25->mOffsetMatrix).a3 = 0.0;
                  (paVar25->mOffsetMatrix).a4 = 0.0;
                  (paVar25->mOffsetMatrix).b1 = 0.0;
                  (paVar25->mOffsetMatrix).b2 = 1.0;
                  (paVar25->mOffsetMatrix).b3 = 0.0;
                  (paVar25->mOffsetMatrix).b4 = 0.0;
                  (paVar25->mOffsetMatrix).c1 = 0.0;
                  (paVar25->mOffsetMatrix).c2 = 0.0;
                  (paVar25->mOffsetMatrix).c3 = 1.0;
                  (paVar25->mOffsetMatrix).c4 = 0.0;
                  (paVar25->mOffsetMatrix).d1 = 0.0;
                  (paVar25->mOffsetMatrix).d2 = 0.0;
                  (paVar25->mOffsetMatrix).d3 = 0.0;
                  (paVar25->mOffsetMatrix).d4 = 1.0;
                  *local_98 = paVar25;
                  pBVar29 = (mesh->mBones).
                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar20 = pBVar29[(long)puVar18].mName._M_string_length;
                  if (uVar20 < 0x400) {
                    (paVar25->mName).length = (ai_uint32)uVar20;
                    memcpy((paVar25->mName).data,pBVar29[(long)puVar18].mName._M_dataplus._M_p,
                           uVar20);
                    (paVar25->mName).data[uVar20] = '\0';
                  }
                  puVar18 = (ulong *)((long)local_a8 + (long)puVar18 * 3 * 8);
                  uVar20 = (long)(puVar18[1] - *puVar18) >> 3;
                  uVar15 = (uint)uVar20;
                  paVar25->mNumWeights = uVar15;
                  uVar20 = uVar20 & 0xffffffff;
                  local_38 = uVar20 * 8;
                  local_88 = pBVar29;
                  paVar26 = (aiVertexWeight *)operator_new__(local_38);
                  if (uVar20 != 0) {
                    memset(paVar26,0,local_38);
                  }
                  paVar25->mWeights = paVar26;
                  pBVar29 = local_88;
                  if (uVar15 != 0) {
                    uVar20 = 0;
                    do {
                      uVar33 = *puVar18;
                      paVar25->mWeights[uVar20].mVertexId = *(uint *)(uVar33 + uVar20 * 8);
                      paVar25->mWeights[uVar20].mWeight = *(float *)(uVar33 + 4 + uVar20 * 8);
                      uVar20 = uVar20 + 1;
                    } while (uVar20 < paVar25->mNumWeights);
                    pBVar29 = (mesh->mBones).
                              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  ppaVar44 = local_98 + 1;
                  pBVar34 = (mesh->mBones).
                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  puVar18 = local_a0;
                  paVar19 = local_a8;
                }
                puVar18 = (ulong *)(ulong)((int)puVar18 + 1);
              } while (puVar18 < (ulong *)((long)pBVar34 - (long)pBVar29 >> 5));
            }
            uVar20 = *(ulong *)((long)paVar19 + -8);
            if (uVar20 != 0) {
              lVar42 = uVar20 * 0x18;
              do {
                pvVar27 = *(void **)((long)paVar19 + lVar42 + -0x18);
                if (pvVar27 != (void *)0x0) {
                  operator_delete(pvVar27,*(long *)((long)paVar19 + -8 + lVar42) - (long)pvVar27);
                }
                lVar42 = lVar42 + -0x18;
              } while (lVar42 != 0);
            }
            operator_delete__((ulong *)((long)paVar19 + -8),uVar20 * 0x18 + 8);
            pMVar43 = local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pMVar17 = local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
        }
LAB_003fa134:
        local_58 = (ulong)((int)local_58 + 1);
        uVar20 = ((long)pMVar43 - (long)pMVar17 >> 5) * -0x2c8590b21642c859;
      } while (local_58 <= uVar20 && uVar20 - local_58 != 0);
    }
    puVar18 = local_40;
    uVar20 = *local_40 * 0x18;
    uVar33 = uVar20;
    uVar36 = *local_40;
    while (uVar36 != 0) {
      pvVar27 = *(void **)((long)puVar18 + (uVar33 - 0x10));
      if (pvVar27 != (void *)0x0) {
        operator_delete(pvVar27,*(long *)((long)puVar18 + uVar33) - (long)pvVar27);
      }
      uVar33 = uVar33 - 0x18;
      uVar36 = uVar33;
    }
    operator_delete__(puVar18,uVar20 + 8);
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector(&local_80);
  }
  return;
}

Assistant:

void ASEImporter::ConvertMeshes(ASE::Mesh& mesh, std::vector<aiMesh*>& avOutMeshes)
{
    // validate the material index of the mesh
    if (mesh.iMaterialIndex >= mParser->m_vMaterials.size())    {
        mesh.iMaterialIndex = (unsigned int)mParser->m_vMaterials.size()-1;
        ASSIMP_LOG_WARN("Material index is out of range");
    }

    // If the material the mesh is assigned to is consisting of submeshes, split it
    if (!mParser->m_vMaterials[mesh.iMaterialIndex].avSubMaterials.empty()) {
        std::vector<ASE::Material> vSubMaterials = mParser->
            m_vMaterials[mesh.iMaterialIndex].avSubMaterials;

        std::vector<unsigned int>* aiSplit = new std::vector<unsigned int>[vSubMaterials.size()];

        // build a list of all faces per sub-material
        for (unsigned int i = 0; i < mesh.mFaces.size();++i)    {
            // check range
            if (mesh.mFaces[i].iMaterial >= vSubMaterials.size()) {
                ASSIMP_LOG_WARN("Submaterial index is out of range");

                // use the last material instead
                aiSplit[vSubMaterials.size()-1].push_back(i);
            }
            else aiSplit[mesh.mFaces[i].iMaterial].push_back(i);
        }

        // now generate submeshes
        for (unsigned int p = 0; p < vSubMaterials.size();++p)  {
            if (!aiSplit[p].empty())    {

                aiMesh* p_pcOut = new aiMesh();
                p_pcOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

                // let the sub material index
                p_pcOut->mMaterialIndex = p;

                // we will need this material
                mParser->m_vMaterials[mesh.iMaterialIndex].avSubMaterials[p].bNeed = true;

                // store the real index here ... color channel 3
                p_pcOut->mColors[3] = (aiColor4D*)(uintptr_t)mesh.iMaterialIndex;

                // store a pointer to the mesh in color channel 2
                p_pcOut->mColors[2] = (aiColor4D*) &mesh;
                avOutMeshes.push_back(p_pcOut);

                // convert vertices
                p_pcOut->mNumVertices = (unsigned int)aiSplit[p].size()*3;
                p_pcOut->mNumFaces = (unsigned int)aiSplit[p].size();

                // receive output vertex weights
                std::vector<std::pair<unsigned int, float> > *avOutputBones = NULL;
                if (!mesh.mBones.empty())   {
                    avOutputBones = new std::vector<std::pair<unsigned int, float> >[mesh.mBones.size()];
                }

                // allocate enough storage for faces
                p_pcOut->mFaces = new aiFace[p_pcOut->mNumFaces];

                unsigned int iBase = 0,iIndex;
                if (p_pcOut->mNumVertices)  {
                    p_pcOut->mVertices = new aiVector3D[p_pcOut->mNumVertices];
                    p_pcOut->mNormals  = new aiVector3D[p_pcOut->mNumVertices];
                    for (unsigned int q = 0; q < aiSplit[p].size();++q) {

                        iIndex = aiSplit[p][q];

                        p_pcOut->mFaces[q].mIndices = new unsigned int[3];
                        p_pcOut->mFaces[q].mNumIndices = 3;

                        for (unsigned int t = 0; t < 3;++t, ++iBase)    {
                            const uint32_t iIndex2 = mesh.mFaces[iIndex].mIndices[t];

                            p_pcOut->mVertices[iBase] = mesh.mPositions [iIndex2];
                            p_pcOut->mNormals [iBase] = mesh.mNormals   [iIndex2];

                            // convert bones, if existing
                            if (!mesh.mBones.empty()) {
                                ai_assert(avOutputBones);
                                // check whether there is a vertex weight for this vertex index
                                if (iIndex2 < mesh.mBoneVertices.size())    {

                                    for (std::vector<std::pair<int,float> >::const_iterator
                                        blubb =  mesh.mBoneVertices[iIndex2].mBoneWeights.begin();
                                        blubb != mesh.mBoneVertices[iIndex2].mBoneWeights.end();++blubb)    {

                                        // NOTE: illegal cases have already been filtered out
                                        avOutputBones[(*blubb).first].push_back(std::pair<unsigned int, float>(
                                            iBase,(*blubb).second));
                                    }
                                }
                            }
                            p_pcOut->mFaces[q].mIndices[t] = iBase;
                        }
                    }
                }
                // convert texture coordinates (up to AI_MAX_NUMBER_OF_TEXTURECOORDS sets supported)
                for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                    if (!mesh.amTexCoords[c].empty())
                    {
                        p_pcOut->mTextureCoords[c] = new aiVector3D[p_pcOut->mNumVertices];
                        iBase = 0;
                        for (unsigned int q = 0; q < aiSplit[p].size();++q) {
                            iIndex = aiSplit[p][q];
                            for (unsigned int t = 0; t < 3;++t) {
                                p_pcOut->mTextureCoords[c][iBase++] = mesh.amTexCoords[c][mesh.mFaces[iIndex].mIndices[t]];
                            }
                        }
                        // Setup the number of valid vertex components
                        p_pcOut->mNumUVComponents[c] = mesh.mNumUVComponents[c];
                    }
                }

                // Convert vertex colors (only one set supported)
                if (!mesh.mVertexColors.empty()){
                    p_pcOut->mColors[0] = new aiColor4D[p_pcOut->mNumVertices];
                    iBase = 0;
                    for (unsigned int q = 0; q < aiSplit[p].size();++q) {
                        iIndex = aiSplit[p][q];
                        for (unsigned int t = 0; t < 3;++t) {
                            p_pcOut->mColors[0][iBase++] = mesh.mVertexColors[mesh.mFaces[iIndex].mIndices[t]];
                        }
                    }
                }
                // Copy bones
                if (!mesh.mBones.empty())   {
                    p_pcOut->mNumBones = 0;
                    for (unsigned int mrspock = 0; mrspock < mesh.mBones.size();++mrspock)
                        if (!avOutputBones[mrspock].empty())p_pcOut->mNumBones++;

                    p_pcOut->mBones = new aiBone* [ p_pcOut->mNumBones ];
                    aiBone** pcBone = p_pcOut->mBones;
                    for (unsigned int mrspock = 0; mrspock < mesh.mBones.size();++mrspock)
                    {
                        if (!avOutputBones[mrspock].empty())    {
                            // we will need this bone. add it to the output mesh and
                            // add all per-vertex weights
                            aiBone* pc = *pcBone = new aiBone();
                            pc->mName.Set(mesh.mBones[mrspock].mName);

                            pc->mNumWeights = (unsigned int)avOutputBones[mrspock].size();
                            pc->mWeights = new aiVertexWeight[pc->mNumWeights];

                            for (unsigned int captainkirk = 0; captainkirk < pc->mNumWeights;++captainkirk)
                            {
                                const std::pair<unsigned int,float>& ref = avOutputBones[mrspock][captainkirk];
                                pc->mWeights[captainkirk].mVertexId = ref.first;
                                pc->mWeights[captainkirk].mWeight = ref.second;
                            }
                            ++pcBone;
                        }
                    }
                    // delete allocated storage
                    delete[] avOutputBones;
                }
            }
        }
        // delete storage
        delete[] aiSplit;
    }
    else
    {
        // Otherwise we can simply copy the data to one output mesh
        // This codepath needs less memory and uses fast memcpy()s
        // to do the actual copying. So I think it is worth the
        // effort here.

        aiMesh* p_pcOut = new aiMesh();
        p_pcOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        // set an empty sub material index
        p_pcOut->mMaterialIndex = ASE::Face::DEFAULT_MATINDEX;
        mParser->m_vMaterials[mesh.iMaterialIndex].bNeed = true;

        // store the real index here ... in color channel 3
        p_pcOut->mColors[3] = (aiColor4D*)(uintptr_t)mesh.iMaterialIndex;

        // store a pointer to the mesh in color channel 2
        p_pcOut->mColors[2] = (aiColor4D*) &mesh;
        avOutMeshes.push_back(p_pcOut);

        // If the mesh hasn't faces or vertices, there are two cases
        // possible: 1. the model is invalid. 2. This is a dummy
        // helper object which we are going to remove later ...
        if (mesh.mFaces.empty() || mesh.mPositions.empty()) {
            return;
        }

        // convert vertices
        p_pcOut->mNumVertices = (unsigned int)mesh.mPositions.size();
        p_pcOut->mNumFaces = (unsigned int)mesh.mFaces.size();

        // allocate enough storage for faces
        p_pcOut->mFaces = new aiFace[p_pcOut->mNumFaces];

        // copy vertices
        p_pcOut->mVertices = new aiVector3D[mesh.mPositions.size()];
        memcpy(p_pcOut->mVertices,&mesh.mPositions[0],
            mesh.mPositions.size() * sizeof(aiVector3D));

        // copy normals
        p_pcOut->mNormals = new aiVector3D[mesh.mNormals.size()];
        memcpy(p_pcOut->mNormals,&mesh.mNormals[0],
            mesh.mNormals.size() * sizeof(aiVector3D));

        // copy texture coordinates
        for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)    {
            if (!mesh.amTexCoords[c].empty())   {
                p_pcOut->mTextureCoords[c] = new aiVector3D[mesh.amTexCoords[c].size()];
                memcpy(p_pcOut->mTextureCoords[c],&mesh.amTexCoords[c][0],
                    mesh.amTexCoords[c].size() * sizeof(aiVector3D));

                // setup the number of valid vertex components
                p_pcOut->mNumUVComponents[c] = mesh.mNumUVComponents[c];
            }
        }

        // copy vertex colors
        if (!mesh.mVertexColors.empty())    {
            p_pcOut->mColors[0] = new aiColor4D[mesh.mVertexColors.size()];
            memcpy(p_pcOut->mColors[0],&mesh.mVertexColors[0],
                mesh.mVertexColors.size() * sizeof(aiColor4D));
        }

        // copy faces
        for (unsigned int iFace = 0; iFace < p_pcOut->mNumFaces;++iFace)    {
            p_pcOut->mFaces[iFace].mNumIndices = 3;
            p_pcOut->mFaces[iFace].mIndices = new unsigned int[3];

            // copy indices
            p_pcOut->mFaces[iFace].mIndices[0] = mesh.mFaces[iFace].mIndices[0];
            p_pcOut->mFaces[iFace].mIndices[1] = mesh.mFaces[iFace].mIndices[1];
            p_pcOut->mFaces[iFace].mIndices[2] = mesh.mFaces[iFace].mIndices[2];
        }

        // copy vertex bones
        if (!mesh.mBones.empty() && !mesh.mBoneVertices.empty())    {
            std::vector<std::vector<aiVertexWeight> > avBonesOut( mesh.mBones.size() );

            // find all vertex weights for this bone
            unsigned int quak = 0;
            for (std::vector<BoneVertex>::const_iterator harrypotter =  mesh.mBoneVertices.begin();
                harrypotter != mesh.mBoneVertices.end();++harrypotter,++quak)   {

                for (std::vector<std::pair<int,float> >::const_iterator
                    ronaldweasley  = (*harrypotter).mBoneWeights.begin();
                    ronaldweasley != (*harrypotter).mBoneWeights.end();++ronaldweasley)
                {
                    aiVertexWeight weight;
                    weight.mVertexId = quak;
                    weight.mWeight = (*ronaldweasley).second;
                    avBonesOut[(*ronaldweasley).first].push_back(weight);
                }
            }

            // now build a final bone list
            p_pcOut->mNumBones = 0;
            for (unsigned int jfkennedy = 0; jfkennedy < mesh.mBones.size();++jfkennedy)
                if (!avBonesOut[jfkennedy].empty())p_pcOut->mNumBones++;

            p_pcOut->mBones = new aiBone*[p_pcOut->mNumBones];
            aiBone** pcBone = p_pcOut->mBones;
            for (unsigned int jfkennedy = 0; jfkennedy < mesh.mBones.size();++jfkennedy)    {
                if (!avBonesOut[jfkennedy].empty()) {
                    aiBone* pc = *pcBone = new aiBone();
                    pc->mName.Set(mesh.mBones[jfkennedy].mName);
                    pc->mNumWeights = (unsigned int)avBonesOut[jfkennedy].size();
                    pc->mWeights = new aiVertexWeight[pc->mNumWeights];
                    ::memcpy(pc->mWeights,&avBonesOut[jfkennedy][0],
                        sizeof(aiVertexWeight) * pc->mNumWeights);
                    ++pcBone;
                }
            }
        }
    }
}